

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  Inst *pIVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = AllocInst(this,1);
  if ((int)uVar3 < 0) {
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                        super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar3,0,0);
    uVar5 = (ulong)a >> 0x20;
    if (uVar5 != 0) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      do {
        uVar2 = uVar5 >> 1;
        if ((uVar5 & 1) == 0) {
          uVar4 = pIVar1[uVar2].out_opcode_ >> 4;
          pIVar1[uVar2].out_opcode_ = pIVar1[uVar2].out_opcode_ & 0xf | uVar3 << 4;
        }
        else {
          uVar4 = pIVar1[uVar2].field_1.out1_;
          pIVar1[uVar2].field_1.cap_ = uVar3;
        }
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    pIVar1 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    if (nongreedy) {
      pIVar1[uVar3].field_1.out1_ = a.begin;
      uVar5 = (ulong)(uVar3 * 2);
    }
    else {
      pIVar1[uVar3].out_opcode_ = pIVar1[uVar3].out_opcode_ & 0xf | a.begin << 4;
      uVar5 = (ulong)(uVar3 * 2 + 1);
    }
  }
  return (Frag)((ulong)uVar3 | uVar5 << 0x20);
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitAlt(0, 0);
  PatchList::Patch(inst_.data(), a.end, id);
  if (nongreedy) {
    inst_[id].out1_ = a.begin;
    return Frag(id, PatchList::Mk(id << 1));
  } else {
    inst_[id].set_out(a.begin);
    return Frag(id, PatchList::Mk((id << 1) | 1));
  }
}